

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O0

void avro::parsing::SimpleParser<avro::parsing::DummyHandler>::assertLessThan(size_t n,size_t s)

{
  ostream *poVar1;
  string *msg;
  ulong in_RSI;
  ulong in_RDI;
  ostringstream oss;
  ostringstream local_188 [376];
  ulong local_10;
  ulong local_8;
  
  if (in_RSI <= in_RDI) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    std::__cxx11::ostringstream::ostringstream(local_188);
    poVar1 = std::operator<<((ostream *)local_188,"Size max value. Upper bound: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    poVar1 = std::operator<<(poVar1," found ");
    std::ostream::operator<<(poVar1,local_8);
    msg = (string *)__cxa_allocate_exception(0x18);
    std::__cxx11::ostringstream::str();
    Exception::Exception((Exception *)poVar1,msg);
    __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

static void assertLessThan(size_t n, size_t s) {
        if (n >= s) {
            std::ostringstream oss;
            oss << "Size max value. Upper bound: " << s << " found " << n;
            throw Exception(oss.str());
        }
    }